

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# H19_binary_search.c
# Opt level: O3

int main(void)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  bool bVar5;
  
  iVar2 = 0;
  iVar4 = 10;
  iVar1 = 10;
  do {
    while( true ) {
      iVar3 = iVar4 / 2;
      if (*(int *)(&DAT_00102010 + (long)iVar3 * 4) == 0x7b) goto LAB_001011d7;
      if (0x7b < *(int *)(&DAT_00102010 + (long)iVar3 * 4)) break;
      iVar2 = iVar3 + 1;
      iVar4 = iVar3 + iVar1 + 1;
      if (iVar1 <= iVar3) {
        bVar5 = false;
        goto LAB_001011dd;
      }
    }
    iVar1 = iVar3 + -1;
    iVar4 = iVar3 + iVar2 + -1;
  } while (iVar2 < iVar3);
  iVar3 = -1;
LAB_001011d7:
  bVar5 = iVar3 == 8;
LAB_001011dd:
  iVar2 = 0;
  iVar4 = 10;
  iVar1 = 10;
  do {
    while( true ) {
      iVar3 = iVar4 / 2;
      if (*(int *)(&DAT_00102010 + (long)iVar3 * 4) == 4) goto LAB_0010122d;
      if (4 < *(int *)(&DAT_00102010 + (long)iVar3 * 4)) break;
      iVar2 = iVar3 + 1;
      iVar4 = iVar3 + iVar1 + 1;
      if (iVar1 <= iVar3) {
        if (bVar5) {
          return 0;
        }
        goto LAB_0010123a;
      }
    }
    iVar1 = iVar3 + -1;
    iVar4 = iVar3 + iVar2 + -1;
  } while (iVar2 < iVar3);
  iVar3 = -1;
LAB_0010122d:
  if (bVar5) {
    if (iVar3 == -1) {
      return 0;
    }
    __assert_fail("notfound == -1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/yahooshiken[P]in-c/H19_binary_search.c"
                  ,0x20,"int main()");
  }
LAB_0010123a:
  __assert_fail("found == 8",
                "/workspace/llm4binary/github/license_all_cmakelists_25/yahooshiken[P]in-c/H19_binary_search.c"
                ,0x1f,"int main()");
}

Assistant:

int main() {
  const int n = 10;
  int arr[n] = {10, 34, 40, 52, 66, 89, 91, 103, 123};

  int found = func(arr, 0, n, 123);
  int notfound = func(arr, 0, n, 4);

  assert(found == 8);
  assert(notfound == -1);

  return 0;
}